

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

type * arithmetic_conversion(type *__return_storage_ptr__,type *type1,type *type2)

{
  type_mode tVar1;
  type_mode tVar2;
  node_t_conflict pnVar3;
  type *ptVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  mir_size_t mVar11;
  anon_union_8_5_3fbb1736_for_u aVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  type t;
  type local_e8;
  type local_a8;
  node_t_conflict pnStack_68;
  type *ptStack_60;
  MIR_alias_t MStack_58;
  type_qual tStack_54;
  type_mode local_50;
  char cStack_4c;
  char cStack_4b;
  undefined2 uStack_4a;
  int iStack_48;
  undefined4 uStack_44;
  mir_size_t mStack_40;
  anon_union_8_5_3fbb1736_for_u aStack_38;
  
  tVar1 = type1->mode;
  if (tVar1 == TM_BASIC) {
    bVar15 = (type1->u).basic_type - TP_BOOL < 0xc;
  }
  else {
    bVar15 = false;
  }
  if (tVar1 == TM_BASIC && !bVar15) {
    bVar15 = (type1->u).basic_type == TP_LDOUBLE || ((type1->u).basic_type & ~TP_VOID) == TP_FLOAT;
  }
  else {
    bVar15 = (bool)(tVar1 == TM_ENUM | bVar15);
  }
  if (bVar15) {
    tVar2 = type2->mode;
    if (tVar2 == TM_BASIC) {
      bVar15 = (type2->u).basic_type - TP_BOOL < 0xc;
    }
    else {
      bVar15 = false;
    }
    if (tVar2 == TM_BASIC && !bVar15) {
      bVar15 = (type2->u).basic_type == TP_LDOUBLE || ((type2->u).basic_type & ~TP_VOID) == TP_FLOAT
      ;
    }
    else {
      bVar15 = (bool)(tVar2 == TM_ENUM | bVar15);
    }
    if (bVar15) {
      *(byte *)&__return_storage_ptr__->type_qual =
           *(byte *)&__return_storage_ptr__->type_qual & 0xf0;
      __return_storage_ptr__->pos_node = (node_t_conflict)0x0;
      __return_storage_ptr__->arr_type = (type *)0x0;
      __return_storage_ptr__->antialias = 0;
      __return_storage_ptr__->align = -1;
      __return_storage_ptr__->raw_size = 0xffffffffffffffff;
      __return_storage_ptr__->func_type_before_adjustment_p = '\0';
      __return_storage_ptr__->unnamed_anon_struct_union_member_type_p = '\0';
      __return_storage_ptr__->mode = TM_BASIC;
      if (((tVar1 == TM_BASIC) && ((type1->u).basic_type - TP_FLOAT < 3)) ||
         ((tVar2 == TM_BASIC && ((type2->u).basic_type - TP_FLOAT < 3)))) {
        if (((tVar1 == TM_BASIC) && ((type1->u).basic_type == TP_LDOUBLE)) ||
           ((tVar2 == TM_BASIC && ((type2->u).basic_type == TP_LDOUBLE)))) {
          (__return_storage_ptr__->u).basic_type = TP_LDOUBLE;
        }
        else if (((tVar1 == TM_BASIC) && ((type1->u).basic_type == TP_DOUBLE)) ||
                ((tVar2 == TM_BASIC && ((type2->u).basic_type == TP_DOUBLE)))) {
          (__return_storage_ptr__->u).basic_type = TP_DOUBLE;
        }
        else if (((tVar1 == TM_BASIC) && ((type1->u).basic_type == TP_FLOAT)) ||
                ((tVar2 == TM_BASIC && ((type2->u).basic_type == TP_FLOAT)))) {
          (__return_storage_ptr__->u).basic_type = TP_FLOAT;
        }
      }
      else {
        integer_promotion(&local_e8,type1);
        integer_promotion(&local_a8,type2);
        iVar13 = signed_integer_type_p(&local_e8);
        iVar14 = signed_integer_type_p(&local_a8);
        if (iVar13 == iVar14) {
          if (local_a8.u.basic_type < local_e8.u.basic_type) {
            local_a8.u.basic_type = local_e8.u.basic_type;
          }
        }
        else {
          iVar13 = signed_integer_type_p(&local_e8);
          aVar12 = local_e8.u;
          mVar11 = local_e8.raw_size;
          uVar9 = local_e8._32_8_;
          uVar7 = local_e8._24_8_;
          uVar5 = local_e8._16_8_;
          ptVar4 = local_e8.arr_type;
          pnVar3 = local_e8.pos_node;
          if (iVar13 != 0) {
            iStack_48 = local_e8.align;
            uStack_44 = local_e8._36_4_;
            mStack_40 = local_e8.raw_size;
            aStack_38 = local_e8.u;
            pnStack_68 = local_e8.pos_node;
            ptStack_60 = local_e8.arr_type;
            MStack_58 = local_e8.antialias;
            tStack_54 = local_e8.type_qual;
            local_50 = local_e8.mode;
            cStack_4c = local_e8.func_type_before_adjustment_p;
            cStack_4b = local_e8.unnamed_anon_struct_union_member_type_p;
            uStack_4a = local_e8._30_2_;
            local_e8.pos_node = local_a8.pos_node;
            local_e8.arr_type = local_a8.arr_type;
            local_e8.antialias = local_a8.antialias;
            local_e8.type_qual = local_a8.type_qual;
            uVar6 = local_e8._16_8_;
            local_e8.mode = local_a8.mode;
            local_e8.func_type_before_adjustment_p = local_a8.func_type_before_adjustment_p;
            local_e8.unnamed_anon_struct_union_member_type_p =
                 local_a8.unnamed_anon_struct_union_member_type_p;
            local_e8._30_2_ = local_a8._30_2_;
            uVar8 = local_e8._24_8_;
            local_e8.align = local_a8.align;
            local_e8._36_4_ = local_a8._36_4_;
            uVar10 = local_e8._32_8_;
            local_e8.raw_size = local_a8.raw_size;
            local_e8.u = local_a8.u;
            local_a8.pos_node = pnVar3;
            local_a8.arr_type = ptVar4;
            local_e8.antialias = (MIR_alias_t)uVar5;
            local_e8.type_qual = SUB84(uVar5,4);
            local_a8.antialias = local_e8.antialias;
            local_a8.type_qual = local_e8.type_qual;
            local_e8.mode = (type_mode)uVar7;
            local_e8.func_type_before_adjustment_p = SUB81(uVar7,4);
            local_e8.unnamed_anon_struct_union_member_type_p = SUB81(uVar7,5);
            local_e8._30_2_ = SUB82(uVar7,6);
            local_a8.mode = local_e8.mode;
            local_a8.func_type_before_adjustment_p = local_e8.func_type_before_adjustment_p;
            local_a8.unnamed_anon_struct_union_member_type_p =
                 local_e8.unnamed_anon_struct_union_member_type_p;
            local_a8._30_2_ = local_e8._30_2_;
            local_e8.align = (int)uVar9;
            local_e8._36_4_ = SUB84(uVar9,4);
            local_a8.align = local_e8.align;
            local_a8._36_4_ = local_e8._36_4_;
            local_a8.raw_size = mVar11;
            local_a8.u = aVar12;
            local_e8._16_8_ = uVar6;
            local_e8._24_8_ = uVar8;
            local_e8._32_8_ = uVar10;
          }
          iVar13 = signed_integer_type_p(&local_e8);
          if ((iVar13 != 0) || (iVar13 = signed_integer_type_p(&local_a8), iVar13 == 0)) {
            __assert_fail("!signed_integer_type_p (&t1) && signed_integer_type_p (&t2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x16a7,
                          "struct type arithmetic_conversion(const struct type *, const struct type *)"
                         );
          }
          if (((local_e8.u.basic_type == TP_ULONG && local_a8.u.basic_type < TP_LONG) ||
              (local_a8.u.basic_type < TP_LLONG && local_e8.u.basic_type == TP_ULLONG)) ||
             (local_e8.u.basic_type != TP_UINT || local_a8.u.basic_type < TP_LONG)) {
            (__return_storage_ptr__->u).basic_type = local_e8.u.basic_type;
            return __return_storage_ptr__;
          }
        }
        (__return_storage_ptr__->u).basic_type = local_a8.u.basic_type;
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("arithmetic_type_p (type1) && arithmetic_type_p (type2)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x168f,
                "struct type arithmetic_conversion(const struct type *, const struct type *)");
}

Assistant:

static struct type arithmetic_conversion (const struct type *type1, const struct type *type2) {
  struct type res, t1, t2;

  assert (arithmetic_type_p (type1) && arithmetic_type_p (type2));
  init_type (&res);
  res.mode = TM_BASIC;
  if (floating_type_p (type1) || floating_type_p (type2)) {
    if ((type1->mode == TM_BASIC && type1->u.basic_type == TP_LDOUBLE)
        || (type2->mode == TM_BASIC && type2->u.basic_type == TP_LDOUBLE)) {
      res.u.basic_type = TP_LDOUBLE;
    } else if ((type1->mode == TM_BASIC && type1->u.basic_type == TP_DOUBLE)
               || (type2->mode == TM_BASIC && type2->u.basic_type == TP_DOUBLE)) {
      res.u.basic_type = TP_DOUBLE;
    } else if ((type1->mode == TM_BASIC && type1->u.basic_type == TP_FLOAT)
               || (type2->mode == TM_BASIC && type2->u.basic_type == TP_FLOAT)) {
      res.u.basic_type = TP_FLOAT;
    }
    return res;
  }
  t1 = integer_promotion (type1);
  t2 = integer_promotion (type2);
  if (signed_integer_type_p (&t1) == signed_integer_type_p (&t2)) {
    res.u.basic_type = t1.u.basic_type < t2.u.basic_type ? t2.u.basic_type : t1.u.basic_type;
  } else {
    struct type t;

    if (signed_integer_type_p (&t1)) SWAP (t1, t2, t);
    assert (!signed_integer_type_p (&t1) && signed_integer_type_p (&t2));
    if ((t1.u.basic_type == TP_ULONG && t2.u.basic_type < TP_LONG)
        || (t1.u.basic_type == TP_ULLONG && t2.u.basic_type < TP_LLONG)) {
      res.u.basic_type = t1.u.basic_type;
    } else if ((t1.u.basic_type == TP_UINT && t2.u.basic_type >= TP_LONG
                && MIR_LONG_MAX >= MIR_UINT_MAX)
               || (t1.u.basic_type == TP_ULONG && t2.u.basic_type >= TP_LLONG
                   && MIR_LLONG_MAX >= MIR_ULONG_MAX)) {
      res.u.basic_type = t2.u.basic_type;
    } else {
      res.u.basic_type = t1.u.basic_type;
    }
  }
  return res;
}